

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O1

Sfm_Lib_t * Sfm_LibPrepare(int nVars,int fTwo,int fDelay,int fVerbose,int fLibVerbose)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  Sfm_Lib_t *pSVar10;
  Mio_Cell2_t *pMVar11;
  int *piVar12;
  ulong uVar13;
  long lVar14;
  undefined1 *puVar15;
  byte bVar16;
  byte bVar17;
  uint uVar18;
  Mio_Cell2_t *pMVar19;
  undefined1 *puVar20;
  long lVar21;
  uint uVar22;
  Mio_Cell2_t *pMVar23;
  uint uVar24;
  ulong uVar25;
  undefined1 *puVar26;
  ulong uVar27;
  word tCur [4];
  int Perm [8];
  word tTemp1 [4];
  timespec ts_1;
  int *pPerm [9];
  int nPerms [9];
  char pRes [1000];
  undefined1 local_548 [8];
  word local_540;
  word local_538;
  word local_530;
  Sfm_Lib_t *local_520;
  Mio_Cell2_t *local_518;
  long local_510;
  ulong local_508;
  int local_500;
  int local_4fc;
  int local_4f8 [8];
  word local_4d8 [4];
  Mio_Cell2_t *local_4b8;
  ulong local_4b0;
  timespec local_4a8;
  ulong local_498 [10];
  int aiStack_448 [12];
  timespec local_418 [62];
  
  iVar7 = clock_gettime(3,local_418);
  if (iVar7 < 0) {
    local_510 = 1;
  }
  else {
    lVar21 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_418[0].tv_nsec),8);
    local_510 = ((lVar21 >> 7) - (lVar21 >> 0x3f)) + local_418[0].tv_sec * -1000000;
  }
  local_500 = fVerbose;
  pSVar10 = Sfm_LibStart(nVars,fDelay,fLibVerbose);
  if (8 < nVars) {
    __assert_fail("nVars <= SFM_SUPP_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                  ,0x1bf,"Sfm_Lib_t *Sfm_LibPrepare(int, int, int, int, int)");
  }
  iVar7 = 6;
  if (nVars < 6) {
    iVar7 = nVars;
  }
  local_508 = (ulong)(uint)nVars;
  pMVar11 = Mio_CollectRootsNewDefault2(iVar7,&pSVar10->nCells,0);
  pSVar10->pCells = pMVar11;
  local_520 = pSVar10;
  pMVar19 = pMVar11 + pSVar10->nCells;
  if (4 < (long)pSVar10->nCells) {
    pMVar11 = pMVar11 + 4;
    do {
      local_498[0] = pMVar11->uTruth;
      uVar9 = *(uint *)&pMVar11->field_0x10;
      *(uint *)&pMVar11->field_0x10 = uVar9 & 0xf3ffffff;
      if (0x6fffffff < uVar9) {
        __assert_fail("nBits >= 0 && nBits <= 64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0xc2,"word Abc_Tt6Mask(int)");
      }
      bVar16 = (byte)(uVar9 >> 0x1c);
      bVar17 = (byte)(-1 << bVar16);
      uVar25 = (local_498[0] << (bVar17 & 0x3f)) >> (bVar17 & 0x3f);
      uVar13 = uVar25 - 1;
      if ((uVar13 < (uVar25 ^ uVar13)) ||
         (bVar16 = (byte)(-1 << bVar16),
         uVar25 = (~local_498[0] << (bVar16 & 0x3f)) >> (bVar16 & 0x3f), uVar13 = uVar25 - 1,
         uVar13 < (uVar25 ^ uVar13))) {
        *(uint *)&pMVar11->field_0x10 = uVar9 & 0xf3ffffff | 0x4000000;
      }
      else {
        iVar7 = Dau_DsdDecompose(local_498,uVar9 >> 0x1c,0,0,(char *)local_418);
        if (iVar7 < 4) {
          *(uint *)&pMVar11->field_0x10 = *(uint *)&pMVar11->field_0x10 & 0xf3ffffff | 0x8000000;
        }
        else if (fLibVerbose != 0) {
          printf("Skipping gate \"%s\" with non-DSD function %s\n",pMVar11->pName,local_418);
        }
      }
      pMVar11 = pMVar11 + 1;
    } while (pMVar11 < pMVar19);
  }
  uVar13 = local_508;
  iVar7 = (int)local_508;
  if (1 < iVar7) {
    uVar25 = 2;
    do {
      piVar12 = Extra_PermSchedule((int)uVar25);
      local_498[uVar25] = (ulong)piVar12;
      uVar25 = uVar25 + 1;
    } while (iVar7 + 1 != uVar25);
  }
  pSVar10 = local_520;
  if (1 < iVar7) {
    uVar25 = 2;
    do {
      iVar8 = Extra_Factorial((int)uVar25);
      aiStack_448[uVar25] = iVar8;
      uVar25 = uVar25 + 1;
    } while (iVar7 + 1 != uVar25);
  }
  pMVar11 = pSVar10->pCells + 4;
  do {
    uVar9 = (uint)uVar13;
    if (pMVar19 <= pMVar11) {
      if ((fTwo != 0) && (pMVar11 = pSVar10->pCells + 4, pMVar11 < pMVar19)) {
        local_4fc = uVar9 + 1;
        do {
          if (((pMVar11->field_0x13 & 0xc) != 0) &&
             (pMVar23 = pSVar10->pCells + 4, pMVar23 < pMVar19)) {
            local_4b8 = pMVar11;
            do {
              if ((((*(uint *)&pMVar23->field_0x10 & 0xc000000) != 0) &&
                  ((int)((*(uint *)&pMVar23->field_0x10 >> 0x1c) +
                        (*(uint *)&pMVar11->field_0x10 >> 0x1c)) <= local_4fc)) &&
                 (0xfffffff < *(uint *)&pMVar23->field_0x10)) {
                uVar9 = *(uint *)&pMVar23->field_0x10 >> 0x1c;
                uVar22 = 0;
                local_518 = pMVar23;
                do {
                  uVar18 = *(uint *)&pMVar11->field_0x10 >> 0x1c;
                  uVar24 = uVar18 + uVar9;
                  if ((uVar24 < 3) || (uVar9 = (uVar18 + uVar9) - 1, (int)uVar13 < (int)uVar9)) {
                    __assert_fail("nFanins >= 2 && nFanins <= nVars",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                                  ,500,"Sfm_Lib_t *Sfm_LibPrepare(int, int, int, int, int)");
                  }
                  uVar13 = 1;
                  if (1 < (int)uVar9) {
                    uVar13 = (ulong)uVar9;
                  }
                  uVar25 = 0;
                  do {
                    local_4f8[uVar25] = (int)uVar25;
                    uVar25 = uVar25 + 1;
                  } while (uVar13 != uVar25);
                  if (pSVar10->nVars < 7) {
                    local_4d8[0] = Sfm_LibTruth6Two(pMVar11,local_518,uVar22);
                    local_548 = (undefined1  [8])local_4d8[0];
                  }
                  else {
                    Sfm_LibTruth8Two(pMVar11,local_518,uVar22,(word *)local_548);
                    if (0 < (long)pSVar10->nWords) {
                      memcpy(local_4d8,local_548,(long)pSVar10->nWords << 3);
                    }
                  }
                  local_4b0 = (ulong)uVar9;
                  iVar7 = aiStack_448[uVar9];
                  if (0 < (long)iVar7) {
                    lVar21 = 0;
                    do {
                      Sfm_LibPrepareAdd(pSVar10,(word *)local_548,local_4f8,uVar9,pMVar11,local_518,
                                        uVar22);
                      if (6 < uVar24) break;
                      uVar18 = pSVar10->nWords;
                      uVar13 = local_498[local_4b0];
                      iVar8 = *(int *)(uVar13 + lVar21 * 4);
                      lVar14 = (long)iVar8;
                      if (lVar14 < 5) {
                        if (0 < (int)uVar18) {
                          uVar25 = s_PMasks[lVar14][0];
                          uVar2 = s_PMasks[lVar14][1];
                          uVar3 = s_PMasks[lVar14][2];
                          uVar27 = 0;
                          do {
                            uVar4 = *(ulong *)(local_548 + uVar27 * 8);
                            bVar16 = (byte)(1 << ((byte)iVar8 & 0x1f));
                            *(ulong *)(local_548 + uVar27 * 8) =
                                 (uVar4 & uVar3) >> (bVar16 & 0x3f) |
                                 (uVar4 & uVar2) << (bVar16 & 0x3f) | uVar4 & uVar25;
                            uVar27 = uVar27 + 1;
                          } while (uVar18 != uVar27);
                        }
                      }
                      else if (iVar8 == 5) {
                        if (0 < (int)uVar18) {
                          puVar15 = local_548;
                          do {
                            puVar1 = (ulong *)(puVar15 + 4);
                            *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
                            puVar15 = puVar15 + 0x10;
                          } while (puVar15 < local_548 + (long)(int)uVar18 * 8);
                        }
                      }
                      else if (0 < (int)uVar18) {
                        uVar6 = 1 << ((byte)iVar8 - 6 & 0x1f);
                        if (iVar8 < 7) {
                          uVar6 = 1;
                        }
                        puVar20 = local_548 + (ulong)(uVar6 * 2) * 8;
                        lVar14 = (long)(int)(uVar6 * 4) * 8;
                        puVar26 = local_548 + (ulong)uVar6 * 8;
                        puVar15 = local_548;
                        do {
                          if (0 < (int)uVar6) {
                            uVar25 = 0;
                            do {
                              uVar5 = *(undefined8 *)(puVar26 + uVar25 * 8);
                              *(undefined8 *)(puVar26 + uVar25 * 8) =
                                   *(undefined8 *)(puVar20 + uVar25 * 8);
                              *(undefined8 *)(puVar20 + uVar25 * 8) = uVar5;
                              uVar25 = uVar25 + 1;
                            } while (uVar6 != uVar25);
                          }
                          puVar15 = puVar15 + (long)(int)(uVar6 * 4) * 8;
                          puVar20 = puVar20 + lVar14;
                          puVar26 = puVar26 + lVar14;
                        } while (puVar15 < local_548 + (long)(int)uVar18 * 8);
                      }
                      lVar14 = (long)*(int *)(uVar13 + lVar21 * 4);
                      iVar8 = local_4f8[lVar14];
                      local_4f8[lVar14] = local_4f8[lVar14 + 1];
                      local_4f8[lVar14 + 1] = iVar8;
                      lVar21 = lVar21 + 1;
                      pSVar10 = local_520;
                      pMVar11 = local_4b8;
                    } while (lVar21 != iVar7);
                  }
                  if (0 < (long)pSVar10->nWords) {
                    lVar21 = 0;
                    do {
                      if (local_4d8[lVar21] != *(word *)(local_548 + lVar21 * 8)) {
                        __assert_fail("Abc_TtEqual(tTemp1, tCur, p->nWords)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                                      ,0x20a,"Sfm_Lib_t *Sfm_LibPrepare(int, int, int, int, int)");
                      }
                      lVar21 = lVar21 + 1;
                    } while (pSVar10->nWords != lVar21);
                  }
                  uVar22 = uVar22 + 1;
                  uVar9 = *(uint *)&local_518->field_0x10 >> 0x1c;
                  pMVar23 = local_518;
                  uVar13 = local_508;
                } while (uVar22 < uVar9);
              }
              pMVar23 = pMVar23 + 1;
            } while (pMVar23 < pMVar19);
          }
          uVar9 = (uint)uVar13;
          pMVar11 = pMVar11 + 1;
        } while (pMVar11 < pMVar19);
      }
      if (1 < (int)uVar9) {
        uVar13 = 2;
        do {
          if ((void *)local_498[uVar13] != (void *)0x0) {
            free((void *)local_498[uVar13]);
            local_498[uVar13] = 0;
          }
          uVar13 = uVar13 + 1;
        } while (uVar9 + 1 != uVar13);
      }
      if (local_500 != 0) {
        uVar22 = pSVar10->vTtMem->nEntries - 2;
        uVar24 = pSVar10->nObjs - pSVar10->nObjRemoved;
        printf("Library processing: Var = %d. Cell = %d.  Fun = %d. Obj = %d. Ave = %.2f.  Skip = %d. Rem = %d.  "
               ,(double)(int)uVar24 / (double)(int)uVar22,(ulong)uVar9,(ulong)(uint)pSVar10->nCells,
               (ulong)uVar22,(ulong)uVar24,(ulong)(uint)pSVar10->nObjSkipped,pSVar10->nObjRemoved);
        iVar8 = 3;
        iVar7 = clock_gettime(3,&local_4a8);
        if (iVar7 < 0) {
          lVar21 = -1;
        }
        else {
          lVar21 = local_4a8.tv_nsec / 1000 + local_4a8.tv_sec * 1000000;
        }
        lVar21 = lVar21 + local_510;
        Abc_Print(iVar8,"%s =","Time");
        Abc_Print(iVar8,"%9.2f sec\n",(double)lVar21 / 1000000.0);
      }
      return pSVar10;
    }
    if (*(uint *)&pMVar11->field_0x10 < 0x20000000) {
LAB_0052824a:
      __assert_fail("nFanins >= 2 && nFanins <= nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                    ,0x1d8,"Sfm_Lib_t *Sfm_LibPrepare(int, int, int, int, int)");
    }
    uVar22 = *(uint *)&pMVar11->field_0x10 >> 0x1c;
    if ((int)uVar9 < (int)uVar22) goto LAB_0052824a;
    uVar13 = 0;
    do {
      local_4f8[uVar13] = (int)uVar13;
      uVar13 = uVar13 + 1;
    } while (uVar22 != uVar13);
    local_4d8[0] = pMVar11->uTruth;
    local_548 = (undefined1  [8])local_4d8[0];
    if (6 < pSVar10->nVars) {
      local_530 = local_4d8[0];
      local_538 = local_4d8[0];
      local_540 = local_4d8[0];
      local_4d8[3] = local_4d8[0];
      local_4d8[2] = local_4d8[0];
      local_4d8[1] = local_4d8[0];
    }
    iVar7 = aiStack_448[uVar22];
    if (0 < (long)iVar7) {
      lVar21 = 0;
      local_518 = pMVar11;
      do {
        pSVar10 = local_520;
        Sfm_LibPrepareAdd(local_520,(word *)local_548,local_4f8,uVar22,local_518,(Mio_Cell2_t *)0x0,
                          -1);
        uVar9 = pSVar10->nWords;
        uVar13 = local_498[uVar22];
        iVar8 = *(int *)(uVar13 + lVar21 * 4);
        lVar14 = (long)iVar8;
        if (lVar14 < 5) {
          if (0 < (int)uVar9) {
            uVar25 = s_PMasks[lVar14][0];
            uVar2 = s_PMasks[lVar14][1];
            uVar3 = s_PMasks[lVar14][2];
            uVar27 = 0;
            do {
              uVar4 = *(ulong *)(local_548 + uVar27 * 8);
              bVar16 = (byte)(1 << ((byte)iVar8 & 0x1f));
              *(ulong *)(local_548 + uVar27 * 8) =
                   (uVar4 & uVar3) >> (bVar16 & 0x3f) |
                   (uVar4 & uVar2) << (bVar16 & 0x3f) | uVar4 & uVar25;
              uVar27 = uVar27 + 1;
            } while (uVar9 != uVar27);
          }
        }
        else if (iVar8 == 5) {
          if (0 < (int)uVar9) {
            puVar15 = local_548;
            do {
              puVar1 = (ulong *)(puVar15 + 4);
              *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
              puVar15 = puVar15 + 0x10;
            } while (puVar15 < local_548 + (long)(int)uVar9 * 8);
          }
        }
        else if (0 < (int)uVar9) {
          uVar24 = 1 << ((byte)iVar8 - 6 & 0x1f);
          if (iVar8 < 7) {
            uVar24 = 1;
          }
          puVar20 = local_548 + (ulong)(uVar24 * 2) * 8;
          lVar14 = (long)(int)(uVar24 * 4) * 8;
          puVar26 = local_548 + (ulong)uVar24 * 8;
          puVar15 = local_548;
          do {
            if (0 < (int)uVar24) {
              uVar25 = 0;
              do {
                uVar5 = *(undefined8 *)(puVar26 + uVar25 * 8);
                *(undefined8 *)(puVar26 + uVar25 * 8) = *(undefined8 *)(puVar20 + uVar25 * 8);
                *(undefined8 *)(puVar20 + uVar25 * 8) = uVar5;
                uVar25 = uVar25 + 1;
              } while (uVar24 != uVar25);
            }
            puVar15 = puVar15 + (long)(int)(uVar24 * 4) * 8;
            puVar20 = puVar20 + lVar14;
            puVar26 = puVar26 + lVar14;
          } while (puVar15 < local_548 + (long)(int)uVar9 * 8);
        }
        lVar14 = (long)*(int *)(uVar13 + lVar21 * 4);
        iVar8 = local_4f8[lVar14];
        local_4f8[lVar14] = local_4f8[lVar14 + 1];
        local_4f8[lVar14 + 1] = iVar8;
        lVar21 = lVar21 + 1;
        pMVar11 = local_518;
      } while (lVar21 != iVar7);
    }
    if (0 < (long)local_520->nWords) {
      lVar21 = 0;
      do {
        if (local_4d8[lVar21] != *(word *)(local_548 + lVar21 * 8)) {
          __assert_fail("Abc_TtEqual(tTemp1, tCur, p->nWords)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                        ,0x1e8,"Sfm_Lib_t *Sfm_LibPrepare(int, int, int, int, int)");
        }
        lVar21 = lVar21 + 1;
      } while (local_520->nWords != lVar21);
    }
    pMVar11 = pMVar11 + 1;
    uVar13 = local_508;
    pSVar10 = local_520;
  } while( true );
}

Assistant:

Sfm_Lib_t * Sfm_LibPrepare( int nVars, int fTwo, int fDelay, int fVerbose, int fLibVerbose )
{
    abctime clk = Abc_Clock();
    Sfm_Lib_t * p = Sfm_LibStart( nVars, fDelay, fLibVerbose );
    Mio_Cell2_t * pCell1, * pCell2, * pLimit;
    int * pPerm[SFM_SUPP_MAX+1], * Perm1, * Perm2, Perm[SFM_SUPP_MAX];
    int nPerms[SFM_SUPP_MAX+1], i, f, n;
    word tTemp1[4], tCur[4];
    char pRes[1000];
    assert( nVars <= SFM_SUPP_MAX );
    // precompute gates
    p->pCells = Mio_CollectRootsNewDefault2( Abc_MinInt(6, nVars), &p->nCells, 0 );
    pLimit = p->pCells + p->nCells;
    // find useful ones
    for ( pCell1 = p->pCells + 4; pCell1 < pLimit; pCell1++ )
    {
        word uTruth = pCell1->uTruth;
        pCell1->Type = 0;
        if ( Abc_Tt6IsAndType(uTruth, pCell1->nFanins) || Abc_Tt6IsOrType(uTruth, pCell1->nFanins) )
            pCell1->Type = 1;
        else if ( Dau_DsdDecompose(&uTruth, pCell1->nFanins, 0, 0, pRes) <= 3 )
            pCell1->Type = 2;
        else if ( fLibVerbose )
            printf( "Skipping gate \"%s\" with non-DSD function %s\n", pCell1->pName, pRes );
    }
    // generate permutations
    for ( i = 2; i <= nVars; i++ )
        pPerm[i] = Extra_PermSchedule( i );
    for ( i = 2; i <= nVars; i++ )
        nPerms[i] = Extra_Factorial( i );
    // add single cells
    for ( pCell1 = p->pCells + 4; pCell1 < pLimit; pCell1++ ) 
    {
        int nFanins = pCell1->nFanins;
        assert( nFanins >= 2 && nFanins <= nVars );
        for ( i = 0; i < nFanins; i++ )
            Perm[i] = i;
        // permute truth table
        tCur[0] = tTemp1[0] = pCell1->uTruth;
        if ( p->nVars > 6 )
            tTemp1[1] = tTemp1[2] = tTemp1[3] = tCur[1] = tCur[2] = tCur[3] = tCur[0];
        for ( n = 0; n < nPerms[nFanins]; n++ )
        {
            Sfm_LibPrepareAdd( p, tCur, Perm, nFanins, pCell1, NULL, -1 );
            // update
            Abc_TtSwapAdjacent( tCur, p->nWords, pPerm[nFanins][n] );
            Perm1 = Perm + pPerm[nFanins][n];
            Perm2 = Perm1 + 1;
            ABC_SWAP( int, *Perm1, *Perm2 );
        }
        assert( Abc_TtEqual(tTemp1, tCur, p->nWords) );
    }
    // add double cells
    if ( fTwo )
    for ( pCell1 = p->pCells + 4; pCell1 < pLimit; pCell1++ ) // Bot
    if ( pCell1->Type > 0 )
    for ( pCell2 = p->pCells + 4; pCell2 < pLimit; pCell2++ ) // Top
    if ( pCell2->Type > 0 )//&& pCell1->Type + pCell2->Type <= 2 )
    if ( (int)pCell1->nFanins + (int)pCell2->nFanins <= nVars + 1 )
    for ( f = 0; f < (int)pCell2->nFanins; f++ )
    {
        int nFanins = pCell1->nFanins + pCell2->nFanins - 1;
        assert( nFanins >= 2 && nFanins <= nVars );
        for ( i = 0; i < nFanins; i++ )
            Perm[i] = i;
        // permute truth table
        if ( p->nVars > 6 )
        {
            Sfm_LibTruth8Two( pCell1, pCell2, f, tCur );
            Abc_TtCopy( tTemp1, tCur, p->nWords, 0 );
        }
        else
            tCur[0] = tTemp1[0] = Sfm_LibTruth6Two( pCell1, pCell2, f );
        for ( n = 0; n < nPerms[nFanins]; n++ )
        {
            Sfm_LibPrepareAdd( p, tCur, Perm, nFanins, pCell1, pCell2, f );
            if ( nFanins > 5 )
                break;
            // update
            Abc_TtSwapAdjacent( tCur, p->nWords, pPerm[nFanins][n] );
            Perm1 = Perm + pPerm[nFanins][n];
            Perm2 = Perm1 + 1;
            ABC_SWAP( int, *Perm1, *Perm2 );
        }
        assert( Abc_TtEqual(tTemp1, tCur, p->nWords) );
    }
    // cleanup
    for ( i = 2; i <= nVars; i++ )
        ABC_FREE( pPerm[i] );
    if ( fVerbose )
    {
        printf( "Library processing: Var = %d. Cell = %d.  Fun = %d. Obj = %d. Ave = %.2f.  Skip = %d. Rem = %d.  ", 
            nVars, p->nCells, Vec_MemEntryNum(p->vTtMem)-2, 
            p->nObjs-p->nObjRemoved, 1.0*(p->nObjs-p->nObjRemoved)/(Vec_MemEntryNum(p->vTtMem)-2), 
            p->nObjSkipped, p->nObjRemoved );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    return p;
}